

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ini_file.cxx
# Opt level: O0

void __thiscall xray_re::xr_ini_file::ini_section::~ini_section(ini_section *this)

{
  ini_section *this_local;
  
  delete_elements<std::vector<xray_re::xr_ini_file::ini_item*,std::allocator<xray_re::xr_ini_file::ini_item*>>>
            (&this->items);
  std::vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>::
  ~vector(&this->items);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

xr_ini_file::ini_section::~ini_section()
{
	delete_elements(items);
}